

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

char * srcdir_path(char *file)

{
  int iVar1;
  char *pcVar2;
  char *p;
  char *file_local;
  
  pcVar2 = getenv("srcdir");
  if (0x1f < srcdir_path::curpath) {
    fprintf(_stderr,"srcdir_path ran out of filepath slots.\n");
  }
  if (srcdir_path::curpath < 0x20) {
    if (pcVar2 == (char *)0x0) {
      srcdir_path::filepath[srcdir_path::curpath][0xfff] = '\0';
      snprintf(srcdir_path::filepath[srcdir_path::curpath],0xfff,"%s",file);
    }
    else {
      srcdir_path::filepath[srcdir_path::curpath][0xfff] = '\0';
      snprintf(srcdir_path::filepath[srcdir_path::curpath],0xfff,"%s/%s",pcVar2,file);
    }
    iVar1 = srcdir_path::curpath;
    srcdir_path::curpath = srcdir_path::curpath + 1;
    return srcdir_path::filepath[iVar1];
  }
  __assert_fail("curpath < NUMPATHS",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/tests/session_fixture.c"
                ,0x109,"const char *srcdir_path(const char *)");
}

Assistant:

const char *srcdir_path(const char *file)
{
#ifdef _WIN32
    static char filepath[NUMPATHS][_MAX_PATH];
#else
    static char filepath[NUMPATHS][MAXPATHLEN];
#endif
    static int curpath;
    char *p = getenv("srcdir");
    if(curpath >= NUMPATHS) {
        fprintf(stderr, "srcdir_path ran out of filepath slots.\n");
    }
    assert(curpath < NUMPATHS);
    if(p) {
        /* Ensure the final string is nul-terminated on Windows */
        filepath[curpath][sizeof(filepath[0]) - 1] = 0;
        snprintf(filepath[curpath], sizeof(filepath[0]) - 1, "%s/%s",
                 p, file);
    }
    else {
        /* Ensure the final string is nul-terminated on Windows */
        filepath[curpath][sizeof(filepath[0]) - 1] = 0;
        snprintf(filepath[curpath], sizeof(filepath[0]) - 1, "%s",
                 file);
    }

    return filepath[curpath++];
}